

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hes_Apu.cpp
# Opt level: O3

void __thiscall
Hes_Apu::osc_output(Hes_Apu *this,int index,Blip_Buffer *center,Blip_Buffer *left,Blip_Buffer *right
                   )

{
  long lVar1;
  
  this->oscs[index].chans[0] = center;
  this->oscs[index].chans[1] = left;
  this->oscs[index].chans[2] = right;
  lVar1 = 0x230;
  do {
    balance_changed(this,(Hes_Osc *)(this->oscs[0].wave + lVar1));
    lVar1 = lVar1 + -0x70;
  } while (lVar1 != -0x70);
  return;
}

Assistant:

void Hes_Apu::osc_output( int index, Blip_Buffer* center, Blip_Buffer* left, Blip_Buffer* right )
{
	require( (unsigned) index < osc_count );
	oscs [index].chans [0] = center;
	oscs [index].chans [1] = left;
	oscs [index].chans [2] = right;
	
	Hes_Osc* osc = &oscs [osc_count];
	do
	{
		osc--;
		balance_changed( *osc );
	}
	while ( osc != oscs );
}